

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_DXT.c
# Opt level: O2

uchar * convert_image_to_DXT5(uchar *uncompressed,int width,int height,int channels,int *out_size)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uchar *puVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uchar *puVar26;
  long lVar27;
  uint uVar28;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  uchar cblock [8];
  uchar ublock [64];
  
  *out_size = 0;
  iVar6 = 0;
  if (channels - 5U < 0xfffffffc || (uncompressed == (uchar *)0x0 || (height < 1 || width < 1))) {
    puVar8 = (uchar *)0x0;
  }
  else {
    uVar7 = (uint)(2U < (uint)channels);
    bVar2 = (byte)channels & 1;
    uVar16 = (width * 4 + 0xcU & 0xfffffff0) * (height + 3U >> 2);
    *out_size = uVar16;
    puVar8 = (uchar *)malloc((ulong)uVar16);
    iVar3 = channels * width;
    iVar4 = iVar3 * 4;
    iVar1 = channels * 4;
    local_114 = (uint)(2U < (uint)channels) * 2;
    local_110 = 0;
    uVar9 = 0;
    local_118 = channels;
    while (uVar9 < (uint)height) {
      iVar19 = height - (int)uVar9;
      if ((int)(uVar9 + 4) < height) {
        iVar19 = 4;
      }
      uVar10 = 0;
      iVar13 = local_118;
      iVar21 = local_114;
      uVar16 = uVar7;
      iVar25 = iVar6;
      while (uVar10 < (uint)width) {
        iVar23 = width - (int)uVar10;
        if ((int)(uVar10 + 4) < width) {
          iVar23 = 4;
        }
        iVar5 = 0;
        iVar20 = iVar21;
        iVar24 = iVar13;
        local_10c = iVar25;
        uVar18 = uVar16;
        for (lVar15 = 0; iVar14 = iVar19, lVar15 < iVar19; lVar15 = lVar15 + 1) {
          lVar27 = (long)iVar5;
          puVar26 = ublock + lVar27 + 3;
          iVar17 = local_10c;
          iVar14 = iVar20;
          iVar11 = iVar24;
          uVar28 = uVar18;
          for (lVar22 = 0; iVar12 = iVar23, lVar22 < iVar23; lVar22 = lVar22 + 1) {
            ublock[lVar27] = uncompressed[iVar17];
            ublock[lVar27 + 1] = uncompressed[(int)uVar28];
            ublock[lVar27 + 2] = uncompressed[iVar14];
            ublock[lVar27 + 3] = uncompressed[(long)iVar11 + -1] * (bVar2 ^ 1) - bVar2;
            lVar27 = lVar27 + 4;
            iVar17 = iVar17 + channels;
            iVar14 = iVar14 + channels;
            uVar28 = uVar28 + channels;
            iVar11 = iVar11 + channels;
            iVar5 = iVar5 + 4;
            puVar26 = puVar26 + 4;
          }
          for (; iVar12 < 4; iVar12 = iVar12 + 1) {
            puVar26[-3] = ublock[0];
            puVar26[-2] = ublock[1];
            puVar26[-1] = ublock[2];
            *puVar26 = ublock[3];
            iVar5 = iVar5 + 4;
            puVar26 = puVar26 + 4;
          }
          local_10c = local_10c + iVar3;
          iVar20 = iVar20 + iVar3;
          uVar18 = uVar18 + iVar3;
          iVar24 = iVar24 + iVar3;
        }
        for (; iVar14 < 4; iVar14 = iVar14 + 1) {
          lVar15 = (long)iVar5;
          for (lVar22 = 0; (int)lVar22 != 0x10; lVar22 = lVar22 + 4) {
            ublock[lVar22 + lVar15] = ublock[0];
            ublock[lVar22 + lVar15 + 1] = ublock[1];
            ublock[lVar22 + lVar15 + 2] = ublock[2];
            ublock[lVar22 + lVar15 + 3] = ublock[3];
          }
          iVar5 = iVar5 + 0x10;
        }
        compress_DDS_alpha_block(ublock,cblock);
        lVar22 = (long)local_110;
        for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 1) {
          puVar8[lVar22] = cblock[lVar15];
          lVar22 = lVar22 + 1;
        }
        compress_DDS_color_block(4,ublock,cblock);
        local_110 = local_110 + 0x10;
        for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 1) {
          puVar8[lVar15 + lVar22] = cblock[lVar15];
        }
        iVar25 = iVar25 + iVar1;
        iVar21 = iVar21 + iVar1;
        uVar16 = uVar16 + iVar1;
        iVar13 = iVar13 + iVar1;
        uVar10 = uVar10 + 4;
      }
      iVar6 = iVar6 + iVar4;
      local_114 = local_114 + iVar4;
      uVar7 = uVar7 + iVar4;
      local_118 = local_118 + iVar4;
      uVar9 = uVar9 + 4;
    }
  }
  return puVar8;
}

Assistant:

unsigned char* convert_image_to_DXT5(
		const unsigned char *const uncompressed,
		int width, int height, int channels,
		int *out_size )
{
	unsigned char *compressed;
	int i, j, x, y;
	unsigned char ublock[16*4];
	unsigned char cblock[8];
	int index = 0, chan_step = 1;
	int block_count = 0, has_alpha;
	/*	error check	*/
	*out_size = 0;
	if( (width < 1) || (height < 1) ||
		(NULL == uncompressed) ||
		(channels < 1) || ( channels > 4) )
	{
		return NULL;
	}
	/*	for channels == 1 or 2, I do not step forward for R,G,B vales	*/
	if( channels < 3 )
	{
		chan_step = 0;
	}
	/*	# channels = 1 or 3 have no alpha, 2 & 4 do have alpha	*/
	has_alpha = 1 - (channels & 1);
	/*	get the RAM for the compressed image
		(16 bytes per 4x4 pixel block)	*/
	*out_size = ((width+3) >> 2) * ((height+3) >> 2) * 16;
	compressed = (unsigned char*)malloc( *out_size );
	/*	go through each block	*/
	for( j = 0; j < height; j += 4 )
	{
		for( i = 0; i < width; i += 4 )
		{
			/*	local variables, and my block counter	*/
			int idx = 0;
			int mx = 4, my = 4;
			if( j+4 >= height )
			{
				my = height - j;
			}
			if( i+4 >= width )
			{
				mx = width - i;
			}
			for( y = 0; y < my; ++y )
			{
				for( x = 0; x < mx; ++x )
				{
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels];
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels+chan_step];
					ublock[idx++] = uncompressed[(j+y)*width*channels+(i+x)*channels+chan_step+chan_step];
					ublock[idx++] =
						has_alpha * uncompressed[(j+y)*width*channels+(i+x)*channels+channels-1]
						+ (1-has_alpha)*255;
				}
				for( x = mx; x < 4; ++x )
				{
					ublock[idx++] = ublock[0];
					ublock[idx++] = ublock[1];
					ublock[idx++] = ublock[2];
					ublock[idx++] = ublock[3];
				}
			}
			for( y = my; y < 4; ++y )
			{
				for( x = 0; x < 4; ++x )
				{
					ublock[idx++] = ublock[0];
					ublock[idx++] = ublock[1];
					ublock[idx++] = ublock[2];
					ublock[idx++] = ublock[3];
				}
			}
			/*	now compress the alpha block	*/
			compress_DDS_alpha_block( ublock, cblock );
			/*	copy the data from the compressed alpha block into the main buffer	*/
			for( x = 0; x < 8; ++x )
			{
				compressed[index++] = cblock[x];
			}
			/*	then compress the color block	*/
			++block_count;
			compress_DDS_color_block( 4, ublock, cblock );
			/*	copy the data from the compressed color block into the main buffer	*/
			for( x = 0; x < 8; ++x )
			{
				compressed[index++] = cblock[x];
			}
		}
	}
	return compressed;
}